

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Base.cpp
# Opt level: O0

void __thiscall adios2::format::BP5Base::BP5Base(BP5Base *this)

{
  void *in_RDI;
  
  memcpy(in_RDI,&DAT_00f806a8,0x88);
  memcpy((void *)((long)in_RDI + 0x88),&DAT_01134ae0,0x60);
  memcpy((void *)((long)in_RDI + 0xe8),&DAT_01134b40,0x60);
  memcpy((void *)((long)in_RDI + 0x148),&PTR_anon_var_dwarf_874321_01134ba0,0x78);
  *(char **)((long)in_RDI + 0x1c0) = "GenericAttributes";
  *(long *)((long)in_RDI + 0x1c8) = (long)in_RDI + 0x148;
  *(undefined4 *)((long)in_RDI + 0x1d0) = 0x20;
  *(undefined8 *)((long)in_RDI + 0x1d8) = 0;
  *(char **)((long)in_RDI + 0x1e0) = "PrimAttr";
  *(long *)((long)in_RDI + 0x1e8) = (long)in_RDI + 0x88;
  *(undefined4 *)((long)in_RDI + 0x1f0) = 0x18;
  *(undefined8 *)((long)in_RDI + 0x1f8) = 0;
  *(char **)((long)in_RDI + 0x200) = "StrAttr";
  *(long *)((long)in_RDI + 0x208) = (long)in_RDI + 0xe8;
  *(undefined4 *)((long)in_RDI + 0x210) = 0x18;
  *(undefined8 *)((long)in_RDI + 0x218) = 0;
  *(undefined8 *)((long)in_RDI + 0x220) = 0;
  *(undefined8 *)((long)in_RDI + 0x228) = 0;
  *(undefined4 *)((long)in_RDI + 0x230) = 0;
  *(undefined8 *)((long)in_RDI + 0x238) = 0;
  *(undefined1 **)((long)in_RDI + 0x240) = MetaArrayRecList;
  *(undefined1 **)((long)in_RDI + 0x248) = MetaArrayRecOperatorList;
  *(undefined1 **)((long)in_RDI + 0x250) = MetaArrayRecMM1List;
  *(undefined1 **)((long)in_RDI + 600) = MetaArrayRecOperatorMM1List;
  *(undefined1 **)((long)in_RDI + 0x260) = MetaArrayRecMM2List;
  *(undefined1 **)((long)in_RDI + 0x268) = MetaArrayRecOperatorMM2List;
  *(undefined1 **)((long)in_RDI + 0x270) = MetaArrayRecMM4List;
  *(undefined1 **)((long)in_RDI + 0x278) = MetaArrayRecOperatorMM4List;
  *(undefined1 **)((long)in_RDI + 0x280) = MetaArrayRecMM8List;
  *(undefined1 **)((long)in_RDI + 0x288) = MetaArrayRecOperatorMM8List;
  *(undefined1 **)((long)in_RDI + 0x290) = MetaArrayRecMM16List;
  *(undefined1 **)((long)in_RDI + 0x298) = MetaArrayRecOperatorMM16List;
  return;
}

Assistant:

BP5Base::BP5Base()
{
    MetaArrayRecListPtr = &MetaArrayRecList[0];
    MetaArrayRecOperatorListPtr = &MetaArrayRecOperatorList[0];
    MetaArrayRecMM1ListPtr = &MetaArrayRecMM1List[0];
    MetaArrayRecOperatorMM1ListPtr = &MetaArrayRecOperatorMM1List[0];
    MetaArrayRecMM2ListPtr = &MetaArrayRecMM2List[0];
    MetaArrayRecOperatorMM2ListPtr = &MetaArrayRecOperatorMM2List[0];
    MetaArrayRecMM4ListPtr = &MetaArrayRecMM4List[0];
    MetaArrayRecOperatorMM4ListPtr = &MetaArrayRecOperatorMM4List[0];
    MetaArrayRecMM8ListPtr = &MetaArrayRecMM8List[0];
    MetaArrayRecOperatorMM8ListPtr = &MetaArrayRecOperatorMM8List[0];
    MetaArrayRecMM16ListPtr = &MetaArrayRecMM16List[0];
    MetaArrayRecOperatorMM16ListPtr = &MetaArrayRecOperatorMM16List[0];
}